

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~ArrayBuilder(ArrayBuilder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  RemoveConst<std::__cxx11::basic_string<char>_> *pRVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  pbVar1 = this->ptr;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pRVar2 = this->pos;
    pbVar3 = this->endPtr;
    this->ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    this->pos = (RemoveConst<std::__cxx11::basic_string<char>_> *)0x0;
    this->endPtr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pbVar1,0x20,(long)pRVar2 - (long)pbVar1 >> 5,
               (long)pbVar3 - (long)pbVar1 >> 5,
               ArrayDisposer::
               Dispose_<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }